

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::NetParameter::NetParameter(NetParameter *this,NetParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  NetState *this_01;
  NetParameter *from_local;
  NetParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__NetParameter_00d4dbe0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::RepeatedPtrField
            (&this->layers_,&from->layers_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->input_,&from->input_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->input_dim_,&from->input_dim_);
  google::protobuf::RepeatedPtrField<caffe::BlobShape>::RepeatedPtrField
            (&this->input_shape_,&from->input_shape_);
  google::protobuf::RepeatedPtrField<caffe::LayerParameter>::RepeatedPtrField
            (&this->layer_,&from->layer_);
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar2);
  bVar1 = has_name(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,psVar2,(from->name_).ptr_);
  }
  bVar1 = has_state(from);
  if (bVar1) {
    this_01 = (NetState *)operator_new(0x38);
    NetState::NetState(this_01,from->state_);
    this->state_ = this_01;
  }
  else {
    this->state_ = (NetState *)0x0;
  }
  memcpy(&this->force_backward_,&from->force_backward_,2);
  return;
}

Assistant:

NetParameter::NetParameter(const NetParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      layers_(from.layers_),
      input_(from.input_),
      input_dim_(from.input_dim_),
      input_shape_(from.input_shape_),
      layer_(from.layer_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_state()) {
    state_ = new ::caffe::NetState(*from.state_);
  } else {
    state_ = NULL;
  }
  ::memcpy(&force_backward_, &from.force_backward_,
    reinterpret_cast<char*>(&debug_info_) -
    reinterpret_cast<char*>(&force_backward_) + sizeof(debug_info_));
  // @@protoc_insertion_point(copy_constructor:caffe.NetParameter)
}